

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

void __thiscall
Js::JavascriptStackWalker::SetCurrentFunction
          (JavascriptStackWalker *this,JavascriptFunction *function)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  void **ppvVar5;
  
  uVar1 = *(ushort *)&this->field_0x50;
  if (((uVar1 >> 2 | uVar1) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x421,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    uVar1 = *(ushort *)&this->field_0x50;
  }
  if ((uVar1 & 1) != 0) {
    InlinedFrameWalker::SetFunctionObject(&this->inlinedFrameWalker,function);
    return;
  }
  ppvVar5 = GetCurrentArgv(this);
  *ppvVar5 = function;
  return;
}

Assistant:

void JavascriptStackWalker::SetCurrentFunction(JavascriptFunction * function)
    {
        Assert(this->IsJavascriptFrame());
#if ENABLE_NATIVE_CODEGEN
        if (inlinedFramesBeingWalked)
        {
            inlinedFrameWalker.SetFunctionObject(function);
        }
        else
#endif
        {
            this->GetCurrentArgv()[JavascriptFunctionArgIndex_Function] = function;
        }
    }